

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSONConfigurePresets.cxx
# Opt level: O1

bool cmCMakePresetsGraphInternal::ConfigurePresetsHelper
               (vector<cmCMakePresetsGraph::ConfigurePreset,_std::allocator<cmCMakePresetsGraph::ConfigurePreset>_>
                *out,Value *value,cmJSONState *state)

{
  bool bVar1;
  int iVar2;
  Object<cmCMakePresetsGraph::ConfigurePreset> *in_RCX;
  code *local_98;
  undefined8 uStack_90;
  code *local_88;
  code *pcStack_80;
  cmJSONState *local_70;
  Value *local_68;
  Object<cmCMakePresetsGraph::ConfigurePreset> local_60;
  
  if (ConfigurePresetsHelper(std::vector<cmCMakePresetsGraph::ConfigurePreset,std::allocator<cmCMakePresetsGraph::ConfigurePreset>>&,Json::Value_const*,cmJSONState*)
      ::helper == '\0') {
    iVar2 = __cxa_guard_acquire(&ConfigurePresetsHelper(std::vector<cmCMakePresetsGraph::ConfigurePreset,std::allocator<cmCMakePresetsGraph::ConfigurePreset>>&,Json::Value_const*,cmJSONState*)
                                 ::helper);
    if (iVar2 != 0) {
      uStack_90 = 0;
      local_98 = cmCMakePresetsErrors::INVALID_PRESETS;
      pcStack_80 = std::
                   _Function_handler<void_(const_Json::Value_*,_cmJSONState_*),_void_(*)(const_Json::Value_*,_cmJSONState_*)>
                   ::_M_invoke;
      local_88 = std::
                 _Function_handler<void_(const_Json::Value_*,_cmJSONState_*),_void_(*)(const_Json::Value_*,_cmJSONState_*)>
                 ::_M_manager;
      cmJSONHelperBuilder::Object<cmCMakePresetsGraph::ConfigurePreset>::Object
                (&local_60,
                 (Object<cmCMakePresetsGraph::ConfigurePreset> *)
                 (anonymous_namespace)::ConfigurePresetHelper);
      cmJSONHelperBuilder::
      Vector<cmCMakePresetsGraph::ConfigurePreset,cmJSONHelperBuilder::Object<cmCMakePresetsGraph::ConfigurePreset>>
                (&ConfigurePresetsHelper::helper,(cmJSONHelperBuilder *)&local_98,
                 (ErrorGenerator *)&local_60,in_RCX);
      cmJSONHelperBuilder::Object<cmCMakePresetsGraph::ConfigurePreset>::~Object(&local_60);
      if (local_88 != (code *)0x0) {
        (*local_88)(&local_98,&local_98,3);
      }
      __cxa_atexit(std::_Function_base::~_Function_base,&ConfigurePresetsHelper::helper,
                   &__dso_handle);
      __cxa_guard_release(&ConfigurePresetsHelper(std::vector<cmCMakePresetsGraph::ConfigurePreset,std::allocator<cmCMakePresetsGraph::ConfigurePreset>>&,Json::Value_const*,cmJSONState*)
                           ::helper);
    }
  }
  local_70 = state;
  local_68 = value;
  if (ConfigurePresetsHelper::helper.super__Function_base._M_manager != (_Manager_type)0x0) {
    bVar1 = (*ConfigurePresetsHelper::helper._M_invoker)
                      ((_Any_data *)&ConfigurePresetsHelper::helper,out,&local_68,&local_70);
    return bVar1;
  }
  std::__throw_bad_function_call();
}

Assistant:

bool ConfigurePresetsHelper(std::vector<ConfigurePreset>& out,
                            const Json::Value* value, cmJSONState* state)
{
  static auto const helper = JSONHelperBuilder::Vector<ConfigurePreset>(
    cmCMakePresetsErrors::INVALID_PRESETS, ConfigurePresetHelper);

  return helper(out, value, state);
}